

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

size_t sysbvm_jit_emitObjectFileSourceFileName(sysbvm_bytecodeJit_t *jit)

{
  _Bool _Var1;
  undefined1 local_51;
  size_t sStack_50;
  char nullTerminator;
  size_t byteSize_1;
  size_t sStack_40;
  char slash;
  size_t byteSize;
  anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 aStack_30;
  _Bool hasEmittedName;
  size_t nameOffset;
  sysbvm_sourceCode_t *sourceCode;
  sysbvm_sourcePosition_t *sourcePosition;
  sysbvm_bytecodeJit_t *jit_local;
  
  sourcePosition = (sysbvm_sourcePosition_t *)jit;
  _Var1 = sysbvm_tuple_isNonNullPointer(jit->sourcePosition);
  if (_Var1) {
    sourceCode = *(sysbvm_sourceCode_t **)&(sourcePosition->header).identityHashAndFlags;
    _Var1 = sysbvm_tuple_isNonNullPointer(sourceCode->text);
    if (_Var1) {
      nameOffset = sourceCode->text;
      aStack_30 = sourcePosition[0x15].header.field_0;
      byteSize._7_1_ = 0;
      if ((*(long *)(nameOffset + 0x18) != 0) &&
         (sStack_40 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(nameOffset + 0x18)),
         sStack_40 != 0)) {
        sysbvm_dynarray_addAll
                  ((sysbvm_dynarray_t *)&sourcePosition[0x14].endIndex,sStack_40,
                   (void *)(*(long *)(nameOffset + 0x18) + 0x10));
        byteSize._7_1_ = 1;
        byteSize_1._7_1_ = 0x2f;
        sysbvm_dynarray_add((sysbvm_dynarray_t *)&sourcePosition[0x14].endIndex,
                            (void *)((long)&byteSize_1 + 7));
      }
      if ((*(long *)(nameOffset + 0x20) != 0) &&
         (sStack_50 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(nameOffset + 0x20)),
         sStack_50 != 0)) {
        sysbvm_dynarray_addAll
                  ((sysbvm_dynarray_t *)&sourcePosition[0x14].endIndex,sStack_50,
                   (void *)(*(long *)(nameOffset + 0x20) + 0x10));
        byteSize._7_1_ = 1;
      }
      if ((byteSize._7_1_ & 1) == 0) {
        jit_local = (sysbvm_bytecodeJit_t *)0x0;
      }
      else {
        local_51 = 0;
        sysbvm_dynarray_add((sysbvm_dynarray_t *)&sourcePosition[0x14].endIndex,&local_51);
        jit_local = (sysbvm_bytecodeJit_t *)aStack_30;
      }
    }
    else {
      jit_local = (sysbvm_bytecodeJit_t *)0x0;
    }
  }
  else {
    jit_local = (sysbvm_bytecodeJit_t *)0x0;
  }
  return (size_t)jit_local;
}

Assistant:

static size_t sysbvm_jit_emitObjectFileSourceFileName(sysbvm_bytecodeJit_t *jit)
{
    if(!sysbvm_tuple_isNonNullPointer(jit->sourcePosition))
        return 0;

    sysbvm_sourcePosition_t *sourcePosition = (sysbvm_sourcePosition_t*)jit->sourcePosition;
    if(!sysbvm_tuple_isNonNullPointer(sourcePosition->sourceCode))
        return 0;

    sysbvm_sourceCode_t *sourceCode = (sysbvm_sourceCode_t*)sourcePosition->sourceCode;
    
    size_t nameOffset = jit->objectFileContent.size;
    bool hasEmittedName = false;

    if(sourceCode->directory)
    {
        size_t byteSize = sysbvm_tuple_getSizeInBytes(sourceCode->directory);
        if(byteSize > 0)
        {
            sysbvm_dynarray_addAll(&jit->objectFileContent, byteSize, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(sourceCode->directory)->bytes);
            hasEmittedName = true;

            char slash = '/';
            sysbvm_dynarray_add(&jit->objectFileContent, &slash);
        }
    }

    if(sourceCode->name)
    {
        size_t byteSize = sysbvm_tuple_getSizeInBytes(sourceCode->name);
        if(byteSize > 0)
        {
            sysbvm_dynarray_addAll(&jit->objectFileContent, byteSize, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(sourceCode->name)->bytes);
            hasEmittedName = true;
        }
    }

    if(!hasEmittedName)
        return 0;

    char nullTerminator = 0;
    sysbvm_dynarray_add(&jit->objectFileContent, &nullTerminator);
    return nameOffset;
}